

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O1

void __thiscall
QtPrivate::QWellArray::paintCellContents(QWellArray *this,QPainter *p,int row,int col,QRect *r)

{
  long in_FS_OFFSET;
  QColor local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QColor::QColor(&local_38,white);
  QPainter::fillRect((QRect *)p,(QColor *)r);
  QColor::QColor(&local_38,black);
  QPainter::setPen((QColor *)p);
  local_38._0_8_ = *(undefined8 *)r;
  local_38._8_8_ = *(undefined8 *)&r->x2;
  QPainter::drawLines((QLine *)p,(int)&local_38);
  local_38.ct._0_4_ = (r->y1).m_i;
  local_38.cspec = (r->x2).m_i;
  local_38._12_4_ = (r->y2).m_i;
  local_38.ct._4_4_ = (r->x1).m_i;
  QPainter::drawLines((QLine *)p,(int)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWellArray::paintCellContents(QPainter *p, int row, int col, const QRect &r)
{
    Q_UNUSED(row);
    Q_UNUSED(col);
    p->fillRect(r, Qt::white);
    p->setPen(Qt::black);
    p->drawLine(r.topLeft(), r.bottomRight());
    p->drawLine(r.topRight(), r.bottomLeft());
}